

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# group.c
# Opt level: O0

int ffgtvf(fitsfile *gfptr,long *firstfailed,int *status)

{
  int iVar1;
  int *in_RDX;
  long *in_RSI;
  bool bVar2;
  long *unaff_retaddr;
  fitsfile *fptr;
  char errstr [71];
  long ngroups;
  long nmembers;
  long i;
  int *in_stack_000000f8;
  long *in_stack_00000100;
  fitsfile *in_stack_00000108;
  int *in_stack_00001080;
  fitsfile **in_stack_00001088;
  int in_stack_00001094;
  fitsfile *in_stack_00001098;
  int *in_stack_00001990;
  fitsfile **in_stack_00001998;
  long in_stack_000019a0;
  fitsfile *in_stack_000019a8;
  int *status_00;
  fitsfile *in_stack_ffffffffffffff78;
  long local_28;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  status_00 = (int *)0x0;
  if (*in_RDX == 0) {
    *in_RSI = 0;
    iVar1 = ffgtnm(fptr,unaff_retaddr,
                   (int *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
    *in_RDX = iVar1;
    local_28 = 1;
    while( true ) {
      bVar2 = false;
      if (local_28 < 1) {
        bVar2 = *in_RDX == 0;
      }
      if (!bVar2) break;
      iVar1 = ffgmop(in_stack_000019a8,in_stack_000019a0,in_stack_00001998,in_stack_00001990);
      *in_RDX = iVar1;
      ffclos(in_stack_ffffffffffffff78,status_00);
      local_28 = local_28 + 1;
    }
    if (*in_RDX == 0) {
      iVar1 = ffgmng(in_stack_00000108,in_stack_00000100,in_stack_000000f8);
      *in_RDX = iVar1;
      local_28 = 1;
      while( true ) {
        bVar2 = false;
        if (local_28 < 1) {
          bVar2 = *in_RDX == 0;
        }
        if (!bVar2) break;
        iVar1 = ffgtop(in_stack_00001098,in_stack_00001094,in_stack_00001088,in_stack_00001080);
        *in_RDX = iVar1;
        ffclos(in_stack_ffffffffffffff78,status_00);
        local_28 = local_28 + 1;
      }
      if (*in_RDX != 0) {
        *in_RSI = -local_28;
        snprintf(&stack0xffffffffffffff78,0x47,
                 "Group table verify failed for GRPID index %ld (ffgtvf)",local_28);
        ffpmsg((char *)0x1cc3ad);
      }
    }
    else {
      *in_RSI = local_28;
      snprintf(&stack0xffffffffffffff78,0x47,"Group table verify failed for member %ld (ffgtvf)",
               local_28);
      ffpmsg((char *)0x1cc2cc);
    }
    iVar1 = *in_RDX;
  }
  else {
    iVar1 = *in_RDX;
  }
  return iVar1;
}

Assistant:

int ffgtvf(fitsfile *gfptr,       /* FITS file pointer to group             */
	   long     *firstfailed, /* Member ID (if positive) of first failed
				     member HDU verify check or GRPID index
				     (if negitive) of first failed group
				     link verify check.                     */
	   int      *status)      /* return status code                     */

/*
 check the integrity of a grouping table to make sure that all group members 
 are accessible and all the links to other grouping tables are valid. The
 firstfailed parameter returns the member ID of the first member HDU to fail
 verification if positive or the first group link to fail if negative; 
 otherwise firstfailed contains a return value of 0.
*/

{
  long i;
  long nmembers = 0;
  long ngroups  = 0;

  char errstr[FLEN_VALUE];

  fitsfile *fptr = NULL;


  if(*status != 0) return(*status);

  *firstfailed = 0;

  do
    {
      /*
	attempt to open all the members of the grouping table. We stop
	at the first member which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_members(gfptr,&nmembers,status);

      for(i = 1; i <= nmembers && *status == 0; ++i)
	{
	  *status = fits_open_member(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status is non-zero from the above loop then record the
	member index that caused the error
      */

      if(*status != 0)
	{
	  *firstfailed = i;
	  snprintf(errstr,FLEN_VALUE,"Group table verify failed for member %ld (ffgtvf)",
		  i);
	  ffpmsg(errstr);
	  continue;
	}

      /*
	attempt to open all the groups linked to this grouping table. We stop
	at the first group which cannot be opened (which implies that it
	cannot be located)
      */

      *status = fits_get_num_groups(gfptr,&ngroups,status);

      for(i = 1; i <= ngroups && *status == 0; ++i)
	{
	  *status = fits_open_group(gfptr,i,&fptr,status);
	  fits_close_file(fptr,status);
	}

      /*
	if the status from the above loop is non-zero, then record the
	GRPIDn index of the group that caused the failure
      */

      if(*status != 0)
	{
	  *firstfailed = -1*i;
	  snprintf(errstr,FLEN_VALUE,
		  "Group table verify failed for GRPID index %ld (ffgtvf)",i);
	  ffpmsg(errstr);
	  continue;
	}

    }while(0);

  return(*status);
}